

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int indexColumnNotNull(Index *pIdx,int iCol)

{
  int iVar1;
  int j;
  int iCol_local;
  Index *pIdx_local;
  
  iVar1 = (int)pIdx->aiColumn[iCol];
  if (iVar1 < 0) {
    if (iVar1 == -1) {
      pIdx_local._4_4_ = 1;
    }
    else {
      pIdx_local._4_4_ = 0;
    }
  }
  else {
    pIdx_local._4_4_ = (uint)pIdx->pTable->aCol[iVar1].notNull;
  }
  return pIdx_local._4_4_;
}

Assistant:

static int indexColumnNotNull(Index *pIdx, int iCol){
  int j;
  assert( pIdx!=0 );
  assert( iCol>=0 && iCol<pIdx->nColumn );
  j = pIdx->aiColumn[iCol];
  if( j>=0 ){
    return pIdx->pTable->aCol[j].notNull;
  }else if( j==(-1) ){
    return 1;
  }else{
    assert( j==(-2) );
    return 0;  /* Assume an indexed expression can always yield a NULL */

  }
}